

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::SetExistingInternal
          (SparseArray<re2::NFA::Thread_*> *this,int i,Thread **v)

{
  Thread *pTVar1;
  bool bVar2;
  int *piVar3;
  IndexValue *pIVar4;
  Thread **v_local;
  int i_local;
  SparseArray<re2::NFA::Thread_*> *this_local;
  
  DebugCheckInvariants(this);
  bVar2 = has_index(this,i);
  if (!bVar2) {
    __assert_fail("has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/sparse_array.h"
                  ,0xe7,
                  "iterator re2::SparseArray<re2::NFA::Thread *>::SetExistingInternal(int, const Value &) [Value = re2::NFA::Thread *]"
                 );
  }
  pTVar1 = *v;
  piVar3 = PODArray<int>::operator[](&this->sparse_,i);
  pIVar4 = PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::operator[]
                     (&this->dense_,*piVar3);
  pIVar4->value_ = pTVar1;
  DebugCheckInvariants(this);
  pIVar4 = PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::data(&this->dense_);
  piVar3 = PODArray<int>::operator[](&this->sparse_,i);
  return pIVar4 + *piVar3;
}

Assistant:

iterator SetExistingInternal(int i, const Value& v) {
    DebugCheckInvariants();
    assert(has_index(i));
    dense_[sparse_[i]].value_ = v;
    DebugCheckInvariants();
    return dense_.data() + sparse_[i];
  }